

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O1

Bag * __thiscall minibag::Bag::readMessageDataHeader(Bag *this,IndexEntry *index_entry)

{
  int iVar1;
  runtime_error *this_00;
  long in_RDX;
  Buffer *buffer;
  uint32_t bytes_read;
  uint32_t data_size;
  stringstream ss;
  uint32_t local_1d0;
  uint32_t local_1cc;
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  miniros::Header::Header((Header *)this);
  iVar1 = (int)index_entry[5].chunk_pos;
  if (iVar1 == 0x66) {
    readMessageDataRecord102((Bag *)index_entry,*(uint64_t *)(in_RDX + 8),(Header *)this);
  }
  else {
    if (iVar1 != 200) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Unhandled version: ",0x13);
      std::ostream::operator<<(local_198,(int)index_entry[5].chunk_pos);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c8);
      *(undefined ***)this_00 = &PTR__runtime_error_00150718;
      __cxa_throw(this_00,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
    }
    buffer = *(Buffer **)(in_RDX + 8);
    decompressChunk((Bag *)index_entry,(uint64_t)buffer);
    readMessageDataHeaderFromBuffer
              ((Bag *)index_entry,buffer,*(uint32_t *)(in_RDX + 0x10),(Header *)this,&local_1cc,
               &local_1d0);
  }
  return this;
}

Assistant:

miniros::Header Bag::readMessageDataHeader(IndexEntry const& index_entry) {
    miniros::Header header;
    uint32_t data_size;
    uint32_t bytes_read;
    switch (version_)
    {
    case 200:
        decompressChunk(index_entry.chunk_pos);
        readMessageDataHeaderFromBuffer(*current_buffer_, index_entry.offset, header, data_size, bytes_read);
        return header;
    case 102:
        readMessageDataRecord102(index_entry.chunk_pos, header);
        return header;
    default:
        {
            std::stringstream ss;
            ss << "Unhandled version: " << version_;
            throw BagFormatException(ss.str());
        }
    }
}